

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O1

void __thiscall
ON_Xform::Rotation(ON_Xform *this,ON_3dPoint *P0,ON_3dVector *X0,ON_3dVector *Y0,ON_3dVector *Z0,
                  ON_3dPoint *P1,ON_3dVector *X1,ON_3dVector *Y1,ON_3dVector *Z1)

{
  long lVar1;
  ON_Xform *pOVar2;
  ON_3dVector *pOVar3;
  ON_Xform *pOVar4;
  byte bVar5;
  ON_Xform R;
  ON_Xform T1;
  ON_Xform T0;
  ON_3dVector local_2b0 [5];
  ON_Xform local_230;
  ON_Xform local_1b0;
  ON_Xform local_130;
  ON_Xform local_b0;
  
  bVar5 = 0;
  ON_3dPoint::operator-((ON_3dVector *)&local_230,&ON_3dPoint::Origin,P0);
  pOVar2 = &IdentityTransformation;
  pOVar4 = &local_b0;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    pOVar4->m_xform[0][0] = pOVar2->m_xform[0][0];
    pOVar2 = (ON_Xform *)((long)pOVar2 + ((ulong)bVar5 * -2 + 1) * 8);
    pOVar4 = (ON_Xform *)((long)pOVar4 + ((ulong)bVar5 * -2 + 1) * 8);
  }
  local_b0.m_xform[0][3] = local_230.m_xform[0][0];
  local_b0.m_xform[1][3] = local_230.m_xform[0][1];
  local_b0.m_xform[2][3] = local_230.m_xform[0][2];
  ON_Xform(&local_230);
  Rotation(&local_230,X0,Y0,Z0,X1,Y1,Z1);
  ON_3dPoint::operator-(local_2b0,P1,&ON_3dPoint::Origin);
  pOVar2 = &IdentityTransformation;
  pOVar4 = &local_130;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    pOVar4->m_xform[0][0] = pOVar2->m_xform[0][0];
    pOVar2 = (ON_Xform *)((long)pOVar2 + ((ulong)bVar5 * -2 + 1) * 8);
    pOVar4 = (ON_Xform *)((long)pOVar4 + ((ulong)bVar5 * -2 + 1) * 8);
  }
  local_130.m_xform[0][3] = local_2b0[0].x;
  local_130.m_xform[1][3] = local_2b0[0].y;
  local_130.m_xform[2][3] = local_2b0[0].z;
  operator*(&local_1b0,&local_130,&local_230);
  operator*((ON_Xform *)local_2b0,&local_1b0,&local_b0);
  pOVar3 = local_2b0;
  for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
    this->m_xform[0][0] = (*(double (*) [4])&pOVar3->x)[0];
    pOVar3 = (ON_3dVector *)((long)pOVar3 + ((ulong)bVar5 * -2 + 1) * 8);
    this = (ON_Xform *)((long)this + ((ulong)bVar5 * -2 + 1) * 8);
  }
  return;
}

Assistant:

void ON_Xform::Rotation(   // (not strictly a rotation)
                            // transformation maps P0 to P1, P0+X0 to P1+X1, ...
  const ON_3dPoint&   P0,  // initial frame center
  const ON_3dVector&  X0, // initial frame X
  const ON_3dVector&  Y0, // initial frame Y
  const ON_3dVector&  Z0, // initial frame Z
  const ON_3dPoint&   P1,  // final frame center
  const ON_3dVector&  X1, // final frame X
  const ON_3dVector&  Y1, // final frame Y
  const ON_3dVector&  Z1  // final frame Z
  )
{
  // transformation maps P0 to P1, P0+X0 to P1+X1, ...

  // T0 translates point P0 to (0,0,0)
  const ON_Xform T0(ON_Xform::TranslationTransformation(ON_3dPoint::Origin - P0));

  ON_Xform R;
  R.Rotation(X0,Y0,Z0,X1,Y1,Z1);

  // T1 translates (0,0,0) to point P1
  ON_Xform T1(ON_Xform::TranslationTransformation(P1 - ON_3dPoint::Origin));

  *this = T1*R*T0;
}